

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ValidationError::ValidationError(ValidationError *this,string *name,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *msg_local;
  string *name_local;
  ValidationError *this_local;
  
  local_20 = msg;
  msg_local = name;
  name_local = (string *)this;
  ::std::operator+(&local_60,name,": ");
  ::std::operator+(&local_40,&local_60,msg);
  ValidationError(this,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}